

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::BranchLayerParams::Clear(BranchLayerParams *this)

{
  if (this->ifbranch_ != (NeuralNetwork *)0x0) {
    (*(this->ifbranch_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->ifbranch_ = (NeuralNetwork *)0x0;
  if (this->elsebranch_ != (NeuralNetwork *)0x0) {
    (*(this->elsebranch_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->elsebranch_ = (NeuralNetwork *)0x0;
  return;
}

Assistant:

void BranchLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BranchLayerParams)
  if (GetArenaNoVirtual() == NULL && ifbranch_ != NULL) {
    delete ifbranch_;
  }
  ifbranch_ = NULL;
  if (GetArenaNoVirtual() == NULL && elsebranch_ != NULL) {
    delete elsebranch_;
  }
  elsebranch_ = NULL;
}